

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

_Bool black_market_ok(town_conflict *town,object *obj)

{
  object *poVar1;
  wchar_t wVar2;
  object **ppoVar3;
  store *psVar4;
  
  if (obj->ego != (ego_item *)0x0) {
    return true;
  }
  if (((obj->to_a < 3) && (obj->to_h < 2)) && (obj->to_d < 3)) {
    wVar2 = object_value_real(obj,L'\x01');
    if (wVar2 < L'\n') {
      return false;
    }
    psVar4 = (store *)&town->stores;
    while (psVar4 = psVar4->next, psVar4 != (store *)0x0) {
      if ((psVar4->sidx != store_black_market_idx) && (psVar4->sidx != store_home_idx)) {
        ppoVar3 = &psVar4->stock;
        while (poVar1 = *ppoVar3, poVar1 != (object *)0x0) {
          ppoVar3 = &poVar1->next;
          if (obj->kind == poVar1->kind) {
            return false;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

static bool black_market_ok(struct town *town, const struct object *obj)
{
	struct store *store;

	/* Ego items are always fine */
	if (obj->ego) return true;

	/* Good items are normally fine */
	if (obj->to_a > 2) return true;
	if (obj->to_h > 1) return true;
	if (obj->to_d > 2) return true;

	/* No cheap items */
	if (object_value_real(obj, 1) < 10) return (false);

	/* Check the other stores */
	for (store = town->stores; store; store = store->next) {
		struct object *stock_obj;

		/* Skip home and black market */
		if (store_is_black_market(store) || store_is_home(store))
			continue;

		/* Check every object in the store */
		for (stock_obj = store->stock; stock_obj; stock_obj = stock_obj->next) {
			/* Compare object kinds */
			if (obj->kind == stock_obj->kind)
				return false;
		}
	}

	/* Otherwise fine */
	return true;
}